

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mir.c
# Opt level: O1

reg_desc_t * find_rd_by_name(MIR_context_t ctx,char *name,MIR_func_t func)

{
  htab_size_t *phVar1;
  uint uVar2;
  gen_ctx *pgVar3;
  VARR_size_t *pVVar4;
  long *plVar5;
  reg_desc_t *prVar6;
  VARR_MIR_proto_t *pVVar7;
  int iVar8;
  htab_hash_t hVar9;
  MIR_alias_t MVar10;
  MIR_error_func_t p_Var11;
  HTAB_EL_size_t *pHVar12;
  c2mir_ctx *pcVar13;
  MIR_context_t string;
  char *pcVar14;
  ulong *puVar15;
  char *pcVar16;
  reg_desc_t *extraout_RAX;
  size_t *in_RCX;
  uint extraout_EDX;
  ulong uVar17;
  MIR_context_t ctx_00;
  MIR_context_t unaff_RBX;
  long lVar18;
  FILE *pFVar19;
  uint *puVar20;
  uint *puVar21;
  FILE *pFVar22;
  uint uVar23;
  void *unaff_RBP;
  ulong uVar24;
  MIR_context_t elem;
  MIR_context_t pMVar25;
  uint uVar26;
  htab_ind_t *phVar28;
  undefined8 *puVar29;
  MIR_alias_t *pMVar30;
  c2mir_ctx *unaff_R13;
  ulong uVar31;
  HTAB_EL_size_t *pHVar32;
  gen_ctx *unaff_R14;
  MIR_context_t pMVar33;
  size_t *psVar34;
  uint *puVar35;
  MIR_str_t str;
  size_t rdn;
  MIR_context_t pMStack_1d0;
  undefined1 auStack_1c8 [32];
  MIR_context_t pMStack_1a8;
  undefined4 uStack_190;
  MIR_context_t *ppMStack_170;
  MIR_context_t apMStack_168 [17];
  io_ctx *piStack_e0;
  MIR_context_t pMStack_d8;
  c2mir_ctx *pcStack_d0;
  MIR_context_t pMStack_c8;
  size_t *psStack_c0;
  code *pcStack_b8;
  MIR_context_t pMStack_b0;
  MIR_error_func_t p_Stack_a8;
  MIR_context_t pMStack_a0;
  MIR_context_t pMStack_98;
  uint uStack_8c;
  size_t *psStack_88;
  c2mir_ctx *pcStack_80;
  htab_ind_t *phStack_78;
  ulong uStack_70;
  MIR_context_t pMStack_68;
  MIR_context_t pMStack_60;
  c2mir_ctx *pcStack_58;
  MIR_context_t pMStack_50;
  size_t *psStack_48;
  size_t local_30;
  MIR_context_t pMVar27;
  
  psVar34 = *(size_t **)(name + 0x78);
  pMVar25 = (MIR_context_t)*psVar34;
  pMVar27 = ctx;
  if (pMVar25 == (MIR_context_t)0x0) {
LAB_00138b56:
    ctx = unaff_RBX;
    find_rd_by_name_cold_4();
  }
  else {
    pMVar27 = (MIR_context_t)pMVar25->error_func;
    if (pMVar27 != (MIR_context_t)0x0) {
      unaff_R14 = pMVar25->gen_ctx;
      pcVar13 = (c2mir_ctx *)((long)&unaff_R14->ctx + 1);
      if (pMVar25->c2mir_ctx < pcVar13) {
        unaff_R13 = pcVar13 + ((ulong)pcVar13 >> 1);
        p_Var11 = (MIR_error_func_t)realloc(pMVar27,(long)unaff_R13 * 0x18);
        pMVar25->error_func = p_Var11;
        pMVar25->c2mir_ctx = unaff_R13;
      }
      pgVar3 = pMVar25->gen_ctx;
      p_Var11 = pMVar25->error_func;
      pMVar25->gen_ctx = (gen_ctx *)((long)&pgVar3->ctx + 1);
      *(undefined8 *)(p_Var11 + (long)pgVar3 * 0x18) = 6;
      *(MIR_context_t *)(p_Var11 + (long)pgVar3 * 0x18 + 8) = ctx;
      pMVar27 = (MIR_context_t)psVar34[1];
      name = (char *)unaff_R14;
      iVar8 = HTAB_size_t_do((HTAB_size_t *)pMVar27,(size_t)unaff_R14,HTAB_FIND,&local_30);
      in_RCX = (size_t *)*psVar34;
      if (iVar8 == 0) {
        if (((in_RCX != (size_t *)0x0) && (in_RCX[2] != 0)) && (*in_RCX != 0)) {
          *in_RCX = *in_RCX - 1;
          return (reg_desc_t *)0x0;
        }
      }
      else {
        if (((in_RCX != (size_t *)0x0) && (in_RCX[2] != 0)) && (*in_RCX != 0)) {
          *in_RCX = *in_RCX - 1;
          return (reg_desc_t *)(in_RCX[2] + local_30 * 0x18);
        }
        find_rd_by_name_cold_1();
      }
      find_rd_by_name_cold_2();
      unaff_RBX = ctx;
      goto LAB_00138b56;
    }
  }
  find_rd_by_name_cold_3();
  pFVar22 = (FILE *)pMVar27->temp_data;
  pMStack_a0 = (MIR_context_t)name;
  pMStack_68 = ctx;
  pMStack_60 = pMVar25;
  pcStack_58 = unaff_R13;
  pMStack_50 = (MIR_context_t)unaff_R14;
  psStack_48 = psVar34;
  if (pFVar22 == (FILE *)0x0) {
    pcStack_b8 = (code *)0x138e91;
    HTAB_size_t_do_cold_8();
    elem = (MIR_context_t)name;
LAB_00138e91:
    pcStack_b8 = (code *)0x138e96;
    HTAB_size_t_do_cold_7();
LAB_00138e96:
    pcStack_b8 = (code *)0x138e9b;
    HTAB_size_t_do_cold_2();
LAB_00138e9b:
    pcStack_b8 = (code *)0x138ea0;
    HTAB_size_t_do_cold_1();
LAB_00138ea0:
    pcStack_b8 = (code *)0x138ea5;
    HTAB_size_t_do_cold_4();
    pcVar13 = unaff_R13;
    in_RCX = psVar34;
LAB_00138ea5:
    pcStack_b8 = (code *)0x138eaa;
    HTAB_size_t_do_cold_6();
LAB_00138eaa:
    pcStack_b8 = (code *)0x138eaf;
    HTAB_size_t_do_cold_5();
  }
  else {
    elem = (MIR_context_t)name;
    if ((VARR_HTAB_EL_size_t *)pMVar27->temp_string == (VARR_HTAB_EL_size_t *)0x0)
    goto LAB_00138e91;
    pcVar13 = (c2mir_ctx *)(ulong)extraout_EDX;
    pFVar19 = *(FILE **)&pFVar22->_flags;
    p_Stack_a8 = pMVar27->error_func;
    uVar23 = extraout_EDX - 1;
    unaff_RBP = (void *)(ulong)uVar23;
    pMStack_b0 = pMVar27;
    if (1 < uVar23) {
LAB_00138cf1:
      pcStack_b8 = (code *)0x138d02;
      hVar9 = (**(_func_htab_hash_t_size_t_void_ptr **)&pMStack_b0->func_redef_permission_p)
                        ((size_t)pMStack_a0,p_Stack_a8);
      uVar26 = hVar9 + (hVar9 == 0);
      pMVar27 = (MIR_context_t)(ulong)uVar26;
      pFVar22 = pFVar19;
      elem = pMStack_b0;
      unaff_R13 = pcVar13;
      psVar34 = in_RCX;
      if ((VARR_htab_ind_t *)pMStack_b0->temp_data == (VARR_htab_ind_t *)0x0) goto LAB_00138e96;
      uStack_8c = uVar23;
      pcStack_80 = pcVar13;
      if ((VARR_HTAB_EL_size_t *)pMStack_b0->temp_string != (VARR_HTAB_EL_size_t *)0x0) {
        uVar17 = (ulong)((int)pFVar19 - 1);
        phVar28 = ((VARR_htab_ind_t *)pMStack_b0->temp_data)->varr;
        pHVar12 = ((VARR_HTAB_EL_size_t *)pMStack_b0->temp_string)->varr;
        uVar24 = (ulong)uVar26;
        pMStack_98 = (MIR_context_t)CONCAT44(pMStack_98._4_4_,uVar26);
        puVar20 = (uint *)0x0;
        pMVar25 = pMStack_b0;
        psStack_88 = in_RCX;
        phStack_78 = phVar28;
        uStack_70 = uVar17;
        do {
          uVar26 = uVar26 & (uint)uVar17;
          puVar35 = phVar28 + uVar26;
          uVar31 = (ulong)*puVar35;
          puVar21 = puVar35;
          if (uVar31 != 0xfffffffe) {
            if (*puVar35 == 0xffffffff) {
              if (1 < uStack_8c) {
                return (reg_desc_t *)0x0;
              }
              *(htab_size_t *)&pMVar25->gen_ctx = *(htab_size_t *)&pMVar25->gen_ctx + 1;
              if (puVar20 != (uint *)0x0) {
                puVar35 = puVar20;
              }
              uVar23 = *(uint *)&pMVar25->c2mir_ctx;
              pHVar12[uVar23].hash = (htab_hash_t)pMVar27;
              pHVar12[uVar23].el = (size_t)pMStack_a0;
              *(uint *)&pMVar25->c2mir_ctx = uVar23 + 1;
              *puVar35 = uVar23;
              *psStack_88 = (size_t)pMStack_a0;
              return (reg_desc_t *)0x0;
            }
            puVar21 = puVar20;
            if (pHVar12[uVar31].hash == (htab_hash_t)pMVar27) {
              pHVar32 = pHVar12 + uVar31;
              pcStack_b8 = (code *)0x138d94;
              iVar8 = (*(code *)pMStack_b0->insn_nops)(pHVar32->el,pMStack_a0,p_Stack_a8);
              pMVar27 = (MIR_context_t)((ulong)pMStack_98 & 0xffffffff);
              uVar17 = uStack_70;
              pMVar25 = pMStack_b0;
              phVar28 = phStack_78;
              if (iVar8 != 0) {
                if ((int)pcStack_80 == 3) {
                  *(htab_size_t *)&pMStack_b0->gen_ctx = *(htab_size_t *)&pMStack_b0->gen_ctx - 1;
                  *puVar35 = 0xfffffffe;
                  if (pMStack_b0->unspec_protos != (VARR_MIR_proto_t *)0x0) {
                    pcStack_b8 = (code *)0x138e5a;
                    (*(code *)pMStack_b0->unspec_protos)(pHVar32->el,p_Stack_a8);
                  }
                  pHVar32->hash = 0;
                }
                else {
                  if ((int)pcStack_80 == 2) {
                    if (pMStack_b0->unspec_protos != (VARR_MIR_proto_t *)0x0) {
                      pcStack_b8 = (code *)0x138e2b;
                      (*(code *)pMStack_b0->unspec_protos)(pHVar32->el,p_Stack_a8);
                    }
                    pHVar32->el = (size_t)pMStack_a0;
                  }
                  *psStack_88 = pHVar32->el;
                }
                return (reg_desc_t *)&DAT_00000001;
              }
            }
          }
          uVar24 = uVar24 >> 0xb;
          uVar26 = (int)uVar24 + 1 + uVar26 * 5;
          phVar1 = (htab_size_t *)((long)&pMVar25->c2mir_ctx + 4);
          *phVar1 = *phVar1 + 1;
          puVar20 = puVar21;
        } while( true );
      }
      goto LAB_00138e9b;
    }
    pMVar25 = (MIR_context_t)((VARR_HTAB_EL_size_t *)pMVar27->temp_string)->els_num;
    if (*(htab_size_t *)&pMVar27->c2mir_ctx != (htab_size_t)pMVar25) goto LAB_00138cf1;
    pMVar27 = (MIR_context_t)pFVar22->_IO_read_end;
    if (pMVar27 == (MIR_context_t)0x0) goto LAB_00138ea5;
    pMVar33 = (MIR_context_t)(ulong)((uint)pFVar19 * 2);
    if ((MIR_context_t)pFVar22->_IO_read_ptr != pMVar33) {
      elem = (MIR_context_t)((long)pMVar33 * 4);
      pcStack_b8 = (code *)0x138bec;
      pMStack_98 = pMVar33;
      pHVar12 = (HTAB_EL_size_t *)realloc(pMVar27,(size_t)elem);
      pFVar22->_IO_read_end = (char *)pHVar12;
      pMVar33 = pMStack_98;
    }
    unaff_R14 = (gen_ctx *)pMVar33;
    pFVar22->_IO_read_ptr = (char *)unaff_R14;
    *(gen_ctx **)&pFVar22->_flags = unaff_R14;
    if ((VARR_htab_ind_t *)pMStack_b0->temp_data == (VARR_htab_ind_t *)0x0) goto LAB_00138eaa;
    if ((int)unaff_R14 != 0) {
      pMVar27 = (MIR_context_t)((VARR_htab_ind_t *)pMStack_b0->temp_data)->varr;
      elem = (MIR_context_t)0xff;
      pcStack_b8 = (code *)0x138c2d;
      memset(pMVar27,0xff,(ulong)((uint)pFVar19 & 0x7fffffff) << 3);
    }
    pFVar22 = (FILE *)pMStack_b0->temp_string;
    unaff_R13 = pcVar13;
    psVar34 = in_RCX;
    if ((pFVar22 == (FILE *)0x0) ||
       (pMVar27 = (MIR_context_t)pFVar22->_IO_read_end, pMVar27 == (MIR_context_t)0x0))
    goto LAB_00138ea0;
    pMVar25 = (MIR_context_t)(ulong)((htab_size_t)pMVar25 * 2);
    if ((MIR_context_t)pFVar22->_IO_read_ptr != pMVar25) {
      elem = (MIR_context_t)((long)pMVar25 << 4);
      pcStack_b8 = (code *)0x138c64;
      pHVar12 = (HTAB_EL_size_t *)realloc(pMVar27,(size_t)elem);
      pFVar22->_IO_read_end = (char *)pHVar12;
    }
    pFVar22->_IO_read_ptr = (char *)pMVar25;
    *(MIR_context_t *)&pFVar22->_flags = pMVar25;
    if ((VARR_HTAB_EL_size_t *)pMStack_b0->temp_string != (VARR_HTAB_EL_size_t *)0x0) {
      pHVar12 = ((VARR_HTAB_EL_size_t *)pMStack_b0->temp_string)->varr;
      uVar26 = *(htab_size_t *)((long)&pMStack_b0->gen_ctx + 4);
      uVar2 = *(uint *)&pMStack_b0->c2mir_ctx;
      *(htab_size_t *)&pMStack_b0->gen_ctx = 0;
      *(htab_size_t *)&pMStack_b0->c2mir_ctx = 0;
      *(htab_size_t *)((long)&pMStack_b0->gen_ctx + 4) = 0;
      if (uVar26 < uVar2) {
        lVar18 = (ulong)uVar2 - (ulong)uVar26;
        psVar34 = &pHVar12[uVar26].el;
        pMVar25 = pMStack_b0;
        do {
          if (((HTAB_EL_size_t *)(psVar34 + -1))->hash != 0) {
            pcStack_b8 = (code *)0x138cca;
            HTAB_size_t_do((HTAB_size_t *)pMVar25,*psVar34,HTAB_INSERT,in_RCX);
            pcStack_b8 = (code *)0x138cdc;
            (*(code *)pMStack_b0->insn_nops)(*in_RCX,*psVar34,p_Stack_a8);
            pMVar25 = pMStack_b0;
          }
          psVar34 = psVar34 + 2;
          lVar18 = lVar18 + -1;
        } while (lVar18 != 0);
        pFVar19 = (FILE *)((ulong)unaff_R14 & 0xffffffff);
        pMVar25 = (MIR_context_t)unaff_R14;
        unaff_R14 = (gen_ctx *)psVar34;
      }
      else {
        pFVar19 = (FILE *)((ulong)unaff_R14 & 0xffffffff);
      }
      goto LAB_00138cf1;
    }
  }
  pcStack_b8 = MIR_change_module_ctx;
  HTAB_size_t_do_cold_3();
  piStack_e0 = (io_ctx *)pFVar22;
  pMStack_d8 = pMVar25;
  pcStack_d0 = pcVar13;
  pMStack_c8 = (MIR_context_t)unaff_R14;
  psStack_c0 = in_RCX;
  pcStack_b8 = (code *)unaff_RBP;
  if (elem != (MIR_context_t)0x0) {
    pVVar4 = elem->insn_nops;
    if (pVVar4 == (VARR_size_t *)0x0) {
      if ((MIR_context_t)(pMVar27->all_modules).head != elem) goto LAB_0013926b;
      (pMVar27->all_modules).head = (MIR_module_t_conflict)elem->unspec_protos;
    }
    else {
      pVVar4[1].varr = &elem->unspec_protos->els_num;
    }
    if (elem->unspec_protos == (VARR_MIR_proto_t *)0x0) {
      if ((MIR_context_t)(pMVar27->all_modules).tail != elem) goto LAB_00139270;
      pVVar7 = (VARR_MIR_proto_t *)&pMVar27->all_modules;
    }
    else {
      pVVar7 = elem->unspec_protos + 1;
    }
    pVVar7->size = (size_t)pVVar4;
    elem->insn_nops = (VARR_size_t *)0x0;
    elem->unspec_protos = (VARR_MIR_proto_t *)0x0;
    DLIST_MIR_module_t_append(&ctx_00->all_modules,(MIR_module_t_conflict)elem);
    pMVar25 = ctx_00;
    pcVar13 = (c2mir_ctx *)get_ctx_str(ctx_00,(char *)elem->c2mir_ctx);
    elem->c2mir_ctx = pcVar13;
    pMVar33 = (MIR_context_t)elem->error_func;
    while( true ) {
      if (pMVar33 == (MIR_context_t)0x0) {
        prVar6 = (reg_desc_t *)pMVar27->curr_label_num;
        if ((reg_desc_t *)ctx_00->curr_label_num < prVar6) {
          ctx_00->curr_label_num = (size_t)prVar6;
        }
        return prVar6;
      }
      if (pMVar33->temp_string != (VARR_char *)0x0) break;
      string = (MIR_context_t)MIR_item_name(pMVar25,(MIR_item_t_conflict)pMVar33);
      if (string != (MIR_context_t)0x0) {
        pcVar14 = get_ctx_str(ctx_00,(char *)string);
        uStack_190 = 0;
        ppMStack_170 = apMStack_168;
        pMStack_1a8 = elem;
        apMStack_168[0] = string;
        iVar8 = HTAB_MIR_item_t_do(pMVar27->module_item_tab,
                                   (MIR_item_t_conflict)(auStack_1c8 + 0x18),HTAB_FIND,
                                   (MIR_item_t_conflict *)&pMStack_1d0);
        if ((iVar8 == 0) || (pMStack_1d0 != pMVar33)) {
          pMVar25 = pMVar33;
          set_item_name((MIR_item_t_conflict)pMVar33,pcVar14);
        }
        else {
          apMStack_168[0] = pMVar33;
          HTAB_MIR_item_t_do(pMVar27->module_item_tab,(MIR_item_t_conflict)pMVar33,HTAB_DELETE,
                             (MIR_item_t_conflict *)apMStack_168);
          set_item_name((MIR_item_t_conflict)pMVar33,pcVar14);
          pMVar25 = (MIR_context_t)ctx_00->module_item_tab;
          HTAB_MIR_item_t_do((HTAB_MIR_item_t *)pMVar25,(MIR_item_t_conflict)pMVar33,HTAB_INSERT,
                             (MIR_item_t_conflict *)apMStack_168);
          if (pMVar33 != apMStack_168[0]) goto LAB_00139247;
        }
      }
      if (*(MIR_item_type_t *)&pMVar33->insn_nops == MIR_func_item) {
        plVar5 = (long *)((anon_union_8_10_166bea1d_for_u *)&pMVar33->used_label_p)->expr_data[5].
                         name;
        if (*plVar5 == 0) goto LAB_00139242;
        puVar15 = (ulong *)*plVar5;
        if (puVar15 == (ulong *)0x0) {
LAB_0013922c:
          MIR_change_module_ctx_cold_3();
          break;
        }
        puVar29 = (undefined8 *)(*(long *)(*plVar5 + 0x10) + 0x28);
        uVar24 = 0;
        while (uVar24 = uVar24 + 1, uVar24 < *puVar15) {
          pcVar14 = get_ctx_str(ctx_00,(char *)puVar29[-1]);
          puVar29[-1] = pcVar14;
          if ((char *)*puVar29 != (char *)0x0) {
            pcVar14 = get_ctx_str(ctx_00,(char *)*puVar29);
            *puVar29 = pcVar14;
          }
          puVar29 = puVar29 + 3;
          puVar15 = (ulong *)*plVar5;
          if (puVar15 == (ulong *)0x0) goto LAB_0013922c;
        }
        pMVar25 = ctx_00;
        change_var_names(ctx_00,(VARR_MIR_var_t *)
                                ((anon_union_8_10_166bea1d_for_u *)&pMVar33->used_label_p)->
                                expr_data[3].load_addr);
        puVar15 = (ulong *)((anon_union_8_10_166bea1d_for_u *)&pMVar33->used_label_p)->expr_data[4].
                           name;
        if ((puVar15 != (ulong *)0x0) && (*puVar15 != 0)) {
          lVar18 = 8;
          uVar24 = 0;
          do {
            uVar17 = puVar15[2];
            pMVar25 = ctx_00;
            pcVar14 = get_ctx_str(ctx_00,*(char **)(uVar17 + lVar18));
            *(char **)(uVar17 + lVar18) = pcVar14;
            uVar24 = uVar24 + 1;
            lVar18 = lVar18 + 0x18;
          } while (uVar24 < *puVar15);
        }
        for (pcVar14 = ((anon_union_8_10_166bea1d_for_u *)&pMVar33->used_label_p)->expr_data[1].name
            ; pcVar14 != (char *)0x0; pcVar14 = *(char **)(pcVar14 + 0x10)) {
          if (*(int *)(pcVar14 + 0x1c) != 0) {
            pMVar30 = (MIR_alias_t *)(pcVar14 + 0x38);
            uVar24 = 0;
            do {
              if ((char)pMVar30[-4] == '\n') {
                if (pMVar30[-1] != 0) {
                  pcVar16 = MIR_alias_name(pMVar27,pMVar30[-1]);
                  pMVar25 = ctx_00;
                  MVar10 = MIR_alias(ctx_00,pcVar16);
                  pMVar30[-1] = MVar10;
                }
                if (*pMVar30 != 0) {
                  pcVar16 = MIR_alias_name(pMVar27,*pMVar30);
                  pMVar25 = ctx_00;
                  MVar10 = MIR_alias(ctx_00,pcVar16);
                  *pMVar30 = MVar10;
                }
              }
              else if ((char)pMVar30[-4] == '\t') {
                pMVar25 = (MIR_context_t)auStack_1c8;
                str.s = *(char **)pMVar30;
                str.len = *(size_t *)(pMVar30 + -2);
                string_store((string_t *)pMVar25,ctx_00,&ctx_00->string_ctx->strings,
                             &ctx_00->string_ctx->string_tab,str);
                *(undefined8 *)(pMVar30 + -2) = auStack_1c8._8_8_;
                *(undefined8 *)pMVar30 = auStack_1c8._16_8_;
              }
              uVar24 = uVar24 + 1;
              pMVar30 = pMVar30 + 0xc;
            } while (uVar24 < *(uint *)(pcVar14 + 0x1c));
          }
        }
      }
      else if (*(MIR_item_type_t *)&pMVar33->insn_nops == MIR_proto_item) {
        pMVar25 = ctx_00;
        change_var_names(ctx_00,(VARR_MIR_var_t *)
                                ((anon_union_8_10_166bea1d_for_u *)&pMVar33->used_label_p)->
                                expr_data[1].expr_item);
      }
      pMVar33 = *(MIR_context_t *)&pMVar33->func_redef_permission_p;
    }
    (*pMVar27->error_func)(MIR_ctx_change_error,"Change context of a loaded module");
LAB_00139242:
    MIR_change_module_ctx_cold_4();
LAB_00139247:
    __assert_fail("item == tab_item",
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir.c"
                  ,0xb11,"void MIR_change_module_ctx(MIR_context_t, MIR_module_t, MIR_context_t)");
  }
  MIR_change_module_ctx_cold_5();
LAB_0013926b:
  MIR_change_module_ctx_cold_1();
LAB_00139270:
  MIR_change_module_ctx_cold_2();
  if (pMVar27 != (MIR_context_t)0x0) {
    switch(*(undefined4 *)&pMVar27->insn_nops) {
    case 0:
    case 1:
    case 5:
    case 6:
    case 7:
    case 8:
    case 9:
      pMVar27->used_label_p->els_num = (size_t)elem;
      break;
    case 2:
    case 3:
    case 4:
      pMVar27->used_label_p = (VARR_uint8_t *)elem;
      break;
    default:
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir.c"
                    ,0xaf1,"void set_item_name(MIR_item_t, const char *)");
    }
    return extraout_RAX;
  }
  __assert_fail("item != ((void*)0)",
                "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir.c"
                ,0xae5,"void set_item_name(MIR_item_t, const char *)");
}

Assistant:

static reg_desc_t *find_rd_by_name (MIR_context_t ctx MIR_UNUSED, const char *name,
                                    MIR_func_t func) {
  func_regs_t func_regs = func->internal;
  size_t rdn, temp_rdn;
  reg_desc_t rd;

  rd.name = (char *) name;
  rd.type = MIR_T_I64;
  rd.reg = 0; /* to eliminate warnings */
  temp_rdn = VARR_LENGTH (reg_desc_t, func_regs->reg_descs);
  VARR_PUSH (reg_desc_t, func_regs->reg_descs, rd);
  if (!HTAB_DO (size_t, func_regs->name2rdn_tab, temp_rdn, HTAB_FIND, rdn)) {
    VARR_POP (reg_desc_t, func_regs->reg_descs);
    return NULL; /* undeclared */
  }
  VARR_POP (reg_desc_t, func_regs->reg_descs);
  return &VARR_ADDR (reg_desc_t, func_regs->reg_descs)[rdn];
}